

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O1

void __thiscall
spvtools::DiagnosticStream::DiagnosticStream(DiagnosticStream *this,DiagnosticStream *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  (this->position_).index = (other->position_).index;
  sVar4 = (other->position_).column;
  (this->position_).line = (other->position_).line;
  (this->position_).column = sVar4;
  *(undefined8 *)&(this->consumer_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->consumer_).super__Function_base._M_functor + 8) = 0;
  (this->consumer_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->consumer_)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (other->consumer_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->consumer_,(_Any_data *)&other->consumer_,__clone_functor);
    (this->consumer_)._M_invoker = (other->consumer_)._M_invoker;
    (this->consumer_).super__Function_base._M_manager =
         (other->consumer_).super__Function_base._M_manager;
  }
  paVar1 = &(this->disassembled_instruction_).field_2;
  (this->disassembled_instruction_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (other->disassembled_instruction_)._M_dataplus._M_p;
  paVar6 = &(other->disassembled_instruction_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar6) {
    uVar5 = *(undefined8 *)((long)&(other->disassembled_instruction_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->disassembled_instruction_).field_2 + 8) = uVar5;
  }
  else {
    (this->disassembled_instruction_)._M_dataplus._M_p = pcVar3;
    (this->disassembled_instruction_).field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->disassembled_instruction_)._M_string_length =
       (other->disassembled_instruction_)._M_string_length;
  (other->disassembled_instruction_)._M_dataplus._M_p = (pointer)paVar6;
  (other->disassembled_instruction_)._M_string_length = 0;
  (other->disassembled_instruction_).field_2._M_local_buf[0] = '\0';
  this->error_ = other->error_;
  other->error_ = SPV_FAILED_MATCH;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

DiagnosticStream::DiagnosticStream(DiagnosticStream&& other)
    : stream_(),
      position_(other.position_),
      consumer_(other.consumer_),
      disassembled_instruction_(std::move(other.disassembled_instruction_)),
      error_(other.error_) {
  // Prevent the other object from emitting output during destruction.
  other.error_ = SPV_FAILED_MATCH;
  // Some platforms are missing support for std::ostringstream functionality,
  // including:  move constructor, swap method.  Either would have been a
  // better choice than copying the string.
  stream_ << other.stream_.str();
}